

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

void __thiscall KDIS::KException::KException(KException *this,KString *Text,KUINT16 EC)

{
  KUINT16 ErrorCode;
  KString local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  KUINT16 local_1a;
  KString *pKStack_18;
  KUINT16 EC_local;
  KString *Text_local;
  KException *this_local;
  
  local_1a = EC;
  pKStack_18 = Text;
  Text_local = (KString *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__KException_0032db58;
  this->m_ui16ErrorCode = local_1a;
  std::operator+(&local_40,pKStack_18,": ");
  KDIS::GetErrorText_abi_cxx11_(&local_70,(KDIS *)(ulong)local_1a,ErrorCode);
  std::operator+(&this->m_sErrorText,&local_40,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( Text + ": " + GetErrorText( EC ) )
    {
    }